

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O1

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int iVar1;
  byte bVar2;
  Inst *pIVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  InstCond *pIVar15;
  int *__s;
  uchar *puVar16;
  byte bVar17;
  int iVar18;
  anon_struct_4_3_47ed7b4f_for_anon_union_4_5_a3ff96c3_for_Inst_2_3 aVar19;
  size_type __n;
  _Head_base<0UL,_int_*,_false> _Var20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  char cVar24;
  int iVar25;
  uint *puVar26;
  _Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter> _Var27;
  bool bVar28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  Instq workq;
  Instq tovisit;
  uint local_274;
  int local_264;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  long local_218;
  long local_210;
  int *local_208;
  SparseSetT<void> local_200;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar28 = (this->onepass_nodes_).ptr_._M_t.
             super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      local_218 = (long)this->inst_count_[2] + 2;
      lVar21 = this->dfa_mem_;
      lVar14 = lVar21 + 3;
      if (-1 < lVar21) {
        lVar14 = lVar21;
      }
      iVar1 = this->bytemap_range_ * 4 + 4;
      __n = (size_type)iVar1;
      auVar5._8_8_ = lVar14 >> 0x3f;
      auVar5._0_8_ = lVar14 >> 2;
      if (local_218 <= SUB168(auVar5 / SEXT816((long)__n),0)) {
        pIVar15 = __gnu_cxx::new_allocator<re2::InstCond>::allocate
                            ((new_allocator<re2::InstCond> *)&local_1b0,
                             (long)(this->inst_count_[3] + this->inst_count_[4] +
                                    this->inst_count_[6] + 1),(void *)0x0);
        iVar25 = this->size_;
        __s = __gnu_cxx::new_allocator<int>::allocate
                        ((new_allocator<int> *)&local_1b0,(long)iVar25,(void *)0x0);
        memset(__s,0xff,(long)iVar25 * 4);
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SparseSetT<void>::SparseSetT(&local_1d8,iVar25);
        SparseSetT<void>::SparseSetT(&local_200,iVar25);
        AddQ(&local_1d8,this->start_);
        __s[this->start_] = 0;
        local_1b0.flushed_ = false;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_238,
                   (iterator)
                   local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
        if (local_1d8.size_ == 0) {
          bVar28 = true;
          iVar25 = 1;
        }
        else {
          iVar25 = 1;
          _Var20._M_head_impl =
               local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
               _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
          do {
            iVar18 = *_Var20._M_head_impl;
            local_210 = (long)__s[iVar18] * __n;
            puVar26 = (uint *)(local_238.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + local_210);
            if (0 < this->bytemap_range_) {
              lVar21 = 0;
              do {
                puVar26[lVar21 + 1] = 0x30;
                lVar21 = lVar21 + 1;
              } while (lVar21 < this->bytemap_range_);
            }
            *puVar26 = 0x30;
            local_200.size_ = 0;
            pIVar15->id = iVar18;
            bVar28 = false;
            pIVar15->cond = 0;
            local_264 = 1;
            local_208 = _Var20._M_head_impl;
            do {
              uVar9 = pIVar15[(long)local_264 + -1].id;
              local_274 = pIVar15[(long)local_264 + -1].cond;
              local_264 = local_264 + -1;
              do {
                pIVar3 = (this->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
                uVar8 = pIVar3[(int)uVar9].out_opcode_;
                cVar24 = '\0';
                switch(uVar8 & 7) {
                case 0:
                  LogMessage::LogMessage
                            (&local_1b0,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/onepass.cc"
                             ,0x1bf);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
                  std::ostream::operator<<
                            ((ostream *)&local_1b0.str_,pIVar3[(int)uVar9].out_opcode_ & 7);
                  LogMessage::~LogMessage(&local_1b0);
                  cVar24 = '\0';
                  break;
                case 1:
                  bVar7 = AddQ(&local_200,uVar9 + 1);
LAB_001c7925:
                  if (bVar7 != false) {
                    uVar9 = uVar9 + 1;
                  }
                  cVar24 = (bVar7 ^ 1U) * '\x02' + '\n';
                  break;
                case 2:
                  iVar10 = __s[uVar8 >> 4];
                  iVar18 = iVar25;
                  if (__s[uVar8 >> 4] == -1) {
                    cVar24 = '\f';
                    if (iVar25 < (int)local_218) {
                      AddQ(&local_1d8,uVar8 >> 4);
                      __s[pIVar3[(int)uVar9].out_opcode_ >> 4] = iVar25;
                      local_1b0.flushed_ = false;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                                (&local_238,
                                 (iterator)
                                 local_238.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,__n,&local_1b0.flushed_);
                      iVar18 = iVar25 + 1;
                      puVar26 = (uint *)(local_238.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + local_210);
                      iVar10 = iVar25;
                      goto LAB_001c79d7;
                    }
                  }
                  else {
LAB_001c79d7:
                    bVar17 = pIVar3[(int)uVar9].field_1.field_3.lo_;
                    uVar8 = (uint)bVar17;
                    if (bVar17 <= pIVar3[(int)uVar9].field_1.field_3.hi_) {
                      uVar22 = iVar10 << 0x10 | local_274;
                      uVar11 = uVar22 | 0x40;
                      if (!bVar28) {
                        uVar11 = uVar22;
                      }
                      do {
                        bVar17 = this->bytemap_[(int)uVar8];
                        uVar22 = 0xff;
                        if (0xff < (int)uVar8) {
                          uVar22 = uVar8;
                        }
                        lVar21 = (long)(int)uVar8;
                        uVar8 = uVar8 - 1;
                        do {
                          uVar23 = uVar22;
                          if (0xfe < lVar21) break;
                          uVar23 = uVar8 + 1;
                          lVar14 = lVar21 + 1;
                          lVar21 = lVar21 + 1;
                          uVar8 = uVar23;
                        } while (this->bytemap_[lVar14] == bVar17);
                        if ((~puVar26[(ulong)bVar17 + 1] & 0x30) == 0) {
                          puVar26[(ulong)bVar17 + 1] = uVar11;
LAB_001c7a5a:
                          cVar24 = '\0';
                          bVar7 = true;
                        }
                        else {
                          if (puVar26[(ulong)bVar17 + 1] == uVar11) goto LAB_001c7a5a;
                          cVar24 = '\f';
                          bVar7 = false;
                        }
                        if (!bVar7) goto LAB_001c7a7f;
                        uVar8 = uVar23 + 1;
                      } while ((int)uVar23 < (int)(uint)pIVar3[(int)uVar9].field_1.field_3.hi_);
                    }
                    cVar24 = '\r';
LAB_001c7a7f:
                    if (cVar24 == '\r') {
                      if ((pIVar3[(int)uVar9].field_1.out1_ & 0x10000) != 0) {
                        aVar19.lo_ = 'a';
                        aVar19.hi_ = '\0';
                        aVar19.hint_foldcase_ = 0;
                        aVar6 = pIVar3[(int)uVar9].field_1.field_3;
                        if (pIVar3[(int)uVar9].field_1.field_3.lo_ < 0x62) {
                          aVar6 = aVar19;
                        }
                        bVar17 = pIVar3[(int)uVar9].field_1.field_3.hi_;
                        if (0x79 < bVar17) {
                          bVar17 = 0x7a;
                        }
                        if (aVar6.lo_ <= bVar17) {
                          iVar25 = ((uint)aVar6 & 0xff) - 0x20;
                          uVar11 = iVar10 << 0x10 | local_274;
                          uVar8 = uVar11 | 0x40;
                          if (!bVar28) {
                            uVar8 = uVar11;
                          }
                          do {
                            bVar2 = this->bytemap_[iVar25];
                            iVar10 = 0xff;
                            if (0xff < iVar25) {
                              iVar10 = iVar25;
                            }
                            iVar12 = iVar25 + -1;
                            lVar21 = (long)iVar25;
                            do {
                              iVar13 = iVar10;
                              if (0xfe < lVar21) break;
                              iVar12 = iVar12 + 1;
                              lVar14 = lVar21 + 1;
                              lVar21 = lVar21 + 1;
                              iVar13 = iVar12;
                            } while (this->bytemap_[lVar14] == bVar2);
                            if ((~puVar26[(ulong)bVar2 + 1] & 0x30) == 0) {
                              puVar26[(ulong)bVar2 + 1] = uVar8;
LAB_001c7b39:
                              cVar24 = '\0';
                              bVar7 = true;
                            }
                            else {
                              if (puVar26[(ulong)bVar2 + 1] == uVar8) goto LAB_001c7b39;
                              cVar24 = '\f';
                              bVar7 = false;
                            }
                            if (!bVar7) goto LAB_001c7b58;
                            iVar25 = iVar13 + 1;
                          } while (iVar13 < (int)(bVar17 - 0x20));
                        }
                        cVar24 = '\x12';
LAB_001c7b58:
                        if (cVar24 != '\x12') goto LAB_001c7ba0;
                      }
                      cVar24 = '\v';
                      if ((pIVar3[(int)uVar9].out_opcode_ & 8) == 0) {
                        bVar7 = AddQ(&local_200,uVar9 + 1);
                        if (bVar7) {
                          uVar9 = uVar9 + 1;
                        }
                        cVar24 = !bVar7 * '\x02' + '\n';
                      }
                    }
                  }
LAB_001c7ba0:
                  iVar25 = iVar18;
                  if (cVar24 == '\v') {
                    cVar24 = '\0';
                  }
                  break;
                default:
                  if ((uVar8 & 8) == 0) {
                    bVar7 = AddQ(&local_200,uVar9 + 1);
                    cVar24 = '\f';
                    if (!bVar7) break;
                    lVar21 = (long)local_264;
                    pIVar15[lVar21].id = uVar9 + 1;
                    local_264 = local_264 + 1;
                    pIVar15[lVar21].cond = local_274;
                  }
                  uVar8 = pIVar3[(int)uVar9].out_opcode_ & 7;
                  if ((uVar8 == 3) && ((int)pIVar3[(int)uVar9].field_1.field_3 < 10)) {
                    local_274 = local_274 | 0x20 << (pIVar3[(int)uVar9].field_1.field_3.lo_ & 0x1f);
                  }
                  if (uVar8 == 4) {
                    local_274 = local_274 | pIVar3[(int)uVar9].field_1.out1_;
                  }
                  bVar7 = AddQ(&local_200,pIVar3[(int)uVar9].out_opcode_ >> 4);
                  cVar24 = '\f';
                  if (bVar7) {
                    uVar9 = pIVar3[(int)uVar9].out_opcode_ >> 4;
                    cVar24 = '\n';
                  }
                  break;
                case 5:
                  if (bVar28) {
                    cVar24 = '\f';
                  }
                  else {
                    *puVar26 = local_274;
                    bVar28 = true;
                    if ((pIVar3[(int)uVar9].out_opcode_ & 8) == 0) {
                      bVar7 = AddQ(&local_200,uVar9 + 1);
                      goto LAB_001c7925;
                    }
                  }
                  break;
                case 7:
                  break;
                }
              } while (cVar24 == '\n');
              if (cVar24 != '\0') goto LAB_001c7c51;
            } while (0 < local_264);
            cVar24 = '\0';
LAB_001c7c51:
            if (cVar24 != '\0') goto LAB_001c7c85;
            _Var20._M_head_impl = local_208 + 1;
          } while (_Var20._M_head_impl !=
                   local_1d8.dense_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_);
          cVar24 = '\x02';
LAB_001c7c85:
          bVar28 = cVar24 == '\x02';
        }
        if (bVar28 != false) {
          _Var27.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>._M_head_impl.
          len_ = (_Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>)(iVar25 * iVar1);
          this->dfa_mem_ =
               this->dfa_mem_ -
               (long)(int)_Var27.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                          ._M_head_impl.len_;
          if ((int)_Var27.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                   _M_head_impl.len_ < 0) {
            std::__throw_bad_alloc();
          }
          puVar16 = (uchar *)operator_new((ulong)(uint)_Var27.
                                                  super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>
                                                  ._M_head_impl.len_);
          puVar4 = (this->onepass_nodes_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = puVar16;
          if (puVar4 != (uchar *)0x0) {
            operator_delete(puVar4);
          }
          (this->onepass_nodes_).ptr_._M_t.
          super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
          super__Tuple_impl<1UL,_re2::PODArray<unsigned_char>::Deleter>.
          super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false> =
               _Var27.super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
               _M_head_impl.len_;
          memmove((this->onepass_nodes_).ptr_._M_t.
                  super___uniq_ptr_impl<unsigned_char,_re2::PODArray<unsigned_char>::Deleter>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_re2::PODArray<unsigned_char>::Deleter>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                  local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)(int)_Var27.
                             super__Head_base<1UL,_re2::PODArray<unsigned_char>::Deleter,_false>.
                             _M_head_impl.len_);
        }
        SparseSetT<void>::~SparseSetT(&local_200);
        SparseSetT<void>::~SparseSetT(&local_1d8);
        if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (__s != (int *)0x0) {
          operator_delete(__s);
        }
        if (pIVar15 == (InstCond *)0x0) {
          return bVar28;
        }
        operator_delete(pIVar15);
        return bVar28;
      }
    }
    bVar28 = false;
  }
  return bVar28;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}